

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Vec<float,_4UL> *v)

{
  code *pcVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  char local_29;
  
  local_29 = '[';
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_29,1);
  lVar3 = 0;
  do {
    poVar2 = std::ostream::_M_insert<double>((double)v->data[lVar3]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  poVar2 = (ostream *)std::ostream::operator<<(os,v->data[3]);
  std::operator<<(poVar2,']');
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vec<T, N>& v) {
        os << '[';

        for (int i = 0; i < N - 1; i++) {
            os << v.data[i] << ", ";
        }

        os << v.data[N - 1] << ']';
    }